

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

EventLogEntry * __thiscall
TTD::TTEventList::GetNextAvailableEntry(TTEventList *this,size_t requiredSize)

{
  byte *pbVar1;
  size_t sVar2;
  EventLogEntry *entry;
  size_t requiredSize_local;
  TTEventList *this_local;
  
  if ((this->m_headBlock == (TTEventListLink *)0x0) ||
     (0xffff < this->m_headBlock->CurrPos + requiredSize)) {
    AddArrayLink(this);
  }
  pbVar1 = this->m_headBlock->BlockData;
  sVar2 = this->m_headBlock->CurrPos;
  this->m_headBlock->CurrPos = requiredSize + this->m_headBlock->CurrPos;
  return (EventLogEntry *)(pbVar1 + sVar2);
}

Assistant:

NSLogEvents::EventLogEntry* TTEventList::GetNextAvailableEntry(size_t requiredSize)
    {
        if((this->m_headBlock == nullptr) || (this->m_headBlock->CurrPos + requiredSize >= TTD_EVENTLOG_LIST_BLOCK_SIZE))
        {
            this->AddArrayLink();
        }

        NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + this->m_headBlock->CurrPos);
        this->m_headBlock->CurrPos += requiredSize;

        return entry;
    }